

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool __thiscall CRPCTable::removeCommand(CRPCTable *this,string *name,CRPCCommand *pcmd)

{
  long lVar1;
  const_iterator __last;
  bool bVar2;
  iterator iVar3;
  iterator __last_00;
  pointer ppVar4;
  long in_FS_OFFSET;
  __normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
  new_end;
  iterator it;
  key_type *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  __normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
  *in_stack_ffffffffffffff78;
  vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *this_00;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
          *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68)
  ;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff78,
                          (_Self *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                  *)in_stack_ffffffffffffff68);
    iVar3 = std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::begin
                      ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                  *)in_stack_ffffffffffffff68);
    __last_00 = std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::end
                          ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                           CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::
    remove<__gnu_cxx::__normal_iterator<CRPCCommand_const**,std::vector<CRPCCommand_const*,std::allocator<CRPCCommand_const*>>>,CRPCCommand_const*>
              ((__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                )iVar3._M_current,
               (__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                )__last_00._M_current,
               (CRPCCommand **)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                  *)in_stack_ffffffffffffff68);
    std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::end
              ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    bVar2 = __gnu_cxx::
            operator==<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                      (in_stack_ffffffffffffff78,
                       (__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                             *)in_stack_ffffffffffffff68);
      this_00 = &ppVar4->second;
      __gnu_cxx::
      __normal_iterator<CRPCCommand_const*const*,std::vector<CRPCCommand_const*,std::allocator<CRPCCommand_const*>>>
      ::__normal_iterator<CRPCCommand_const**>
                ((__normal_iterator<const_CRPCCommand_*const_*,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                  *)this_00,
                 (__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                    *)in_stack_ffffffffffffff68);
      iVar3 = std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::end
                        ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                         CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      __gnu_cxx::
      __normal_iterator<CRPCCommand_const*const*,std::vector<CRPCCommand_const*,std::allocator<CRPCCommand_const*>>>
      ::__normal_iterator<CRPCCommand_const**>
                ((__normal_iterator<const_CRPCCommand_*const_*,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                  *)this_00,
                 (__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      __last._M_current._7_1_ = in_stack_ffffffffffffffb7;
      __last._M_current._0_7_ = in_stack_ffffffffffffffb0;
      std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::erase
                ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                 __last_00._M_current,(const_iterator)iVar3._M_current,__last);
      bVar2 = true;
      goto LAB_013e46ec;
    }
  }
  bVar2 = false;
LAB_013e46ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CRPCTable::removeCommand(const std::string& name, const CRPCCommand* pcmd)
{
    auto it = mapCommands.find(name);
    if (it != mapCommands.end()) {
        auto new_end = std::remove(it->second.begin(), it->second.end(), pcmd);
        if (it->second.end() != new_end) {
            it->second.erase(new_end, it->second.end());
            return true;
        }
    }
    return false;
}